

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::TcpSocketEngine::TcpSocketEngine(TcpSocketEngine *this)

{
  this->m_socketDescriptor = -1;
  HostAddress::HostAddress(&this->m_remoteAddress);
  this->m_remotePort = 0;
  this->m_socketError = UnknownSocketError;
  this->m_socketState = UnconnectedState;
  (this->m_errorString)._M_dataplus._M_p = (pointer)&(this->m_errorString).field_2;
  (this->m_errorString)._M_string_length = 0;
  (this->m_errorString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

TcpSocketEngine::TcpSocketEngine()
    : m_socketDescriptor(-1)
    //    , m_localPort(0)
    , m_remotePort(0)
    , m_socketError(TcpSocket::UnknownSocketError)
    , m_socketState(TcpSocket::UnconnectedState)
{}